

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autogenerated_settings.cpp
# Opt level: O2

void duckdb::HTTPProxyPasswordSetting::SetGlobal(DatabaseInstance *db,DBConfig *config,Value *input)

{
  string local_30;
  
  Value::GetValue<std::__cxx11::string>(&local_30,input);
  ::std::__cxx11::string::operator=
            ((string *)&(config->options).http_proxy_password,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void HTTPProxyPasswordSetting::SetGlobal(DatabaseInstance *db, DBConfig &config, const Value &input) {
	config.options.http_proxy_password = input.GetValue<string>();
}